

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O3

void __thiscall
ConfidentialNonce_Constractor_Test::TestBody(ConfidentialNonce_Constractor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  ConfidentialNonce nonce;
  AssertHelper local_78;
  Message local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_60;
  AssertHelper local_40;
  ConfidentialNonce local_38;
  
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_38);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_60,&local_38);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_70,"nonce.GetHex().c_str()","\"\"",
             (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
  }
  if (local_70.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                       (char)local_60._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::GetData((ByteData *)&local_60,&local_38);
  local_78.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize((ByteData *)&local_60);
  local_40.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_70,"nonce.GetData().GetDataSize()","0",(unsigned_long *)&local_78,
             (int *)&local_40);
  if ((void *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p
                                    ));
  }
  if (local_70.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                       (char)local_60._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ss_.ptr_._0_1_ = (internal)cfd::core::ConfidentialNonce::HasBlinding(&local_38);
  local_78.data_ = local_78.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_60,"nonce.HasBlinding()","false",(bool *)&local_70,(bool *)&local_78
            );
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_70);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ss_.ptr_._0_1_ = (internal)cfd::core::ConfidentialNonce::IsEmpty(&local_38);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_70.ss_.ptr_._0_1_) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_70,(AssertionResult *)"nonce.IsEmpty()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x16,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0068d410;
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor) {
  ConfidentialNonce nonce;

  EXPECT_STREQ(nonce.GetHex().c_str(), "");
  EXPECT_EQ(nonce.GetData().GetDataSize(), 0);
  EXPECT_EQ(nonce.HasBlinding(), false);
  EXPECT_TRUE(nonce.IsEmpty());
}